

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::filter_coarsen_min_qual
          (Omega_h *this,Read<signed_char> *cand_codes,Reals *cand_quals,Real min_qual)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *this_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Read<signed_char> RVar4;
  Bytes keep_dirs;
  Read<signed_char> local_58;
  Read<double> local_48;
  Alloc *local_38;
  void *local_30;
  Read<signed_char> local_28;
  void *pvVar3;
  
  local_48.write_.shared_alloc_.alloc = (cand_quals->write_).shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.write_.shared_alloc_.alloc)->use_count =
           (local_48.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48.write_.shared_alloc_.direct_ptr = (cand_quals->write_).shared_alloc_.direct_ptr;
  each_geq_to<double>((Omega_h *)&local_38,&local_48,min_qual);
  pAVar2 = local_48.write_.shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_58.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.write_.shared_alloc_.alloc)->use_count =
           (local_58.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar2 = local_58.write_.shared_alloc_.alloc;
  local_58.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
  local_28.write_.shared_alloc_.alloc = local_38;
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_28.write_.shared_alloc_.alloc = (Alloc *)(local_38->size * 8 + 1);
    }
    else {
      local_38->use_count = local_38->use_count + 1;
    }
  }
  this_00 = local_28.write_.shared_alloc_.alloc;
  local_28.write_.shared_alloc_.direct_ptr = local_30;
  RVar4 = filter_coarsen_dirs(this,&local_58,&local_28);
  pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    piVar1 = &local_38->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38);
      operator_delete(local_38,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_min_qual(
    Read<I8> cand_codes, Reals cand_quals, Real min_qual) {
  auto keep_dirs = each_geq_to(cand_quals, min_qual);
  return filter_coarsen_dirs(cand_codes, keep_dirs);
}